

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar3;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar4;
  double *pdVar5;
  ulong uVar6;
  value_type vVar7;
  double dVar8;
  double dVar9;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  uVar1 = ((*(Fad<double> **)((long)&(((pFVar3->fadexpr_).left_)->fadexpr_).expr_.fadexpr_ + 0x10))
          ->dx_).num_elts;
  uVar2 = (((((pFVar3->fadexpr_).right_)->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar6 = (long)(int)uVar2 << 3;
      }
      pdVar5 = (double *)operator_new__(uVar6);
      (this->dx_).ptr_to_data = pdVar5;
    }
  }
  if (uVar2 != 0) {
    pdVar5 = (this->dx_).ptr_to_data;
    pFVar3 = (fadexpr->fadexpr_).left_;
    if ((((*(Fad<double> **)((long)&(((pFVar3->fadexpr_).left_)->fadexpr_).expr_.fadexpr_ + 0x10))->
         dx_).num_elts == 0) ||
       ((((((pFVar3->fadexpr_).right_)->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          vVar7 = FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                  ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar6);
          pdVar5[uVar6] = vVar7 * (fadexpr->fadexpr_).right_.constant_;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
    }
    else if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        vVar7 = FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                ::fastAccessDx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar6);
        pdVar5[uVar6] = vVar7 * (fadexpr->fadexpr_).right_.constant_;
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  dVar8 = sin((pFVar4->fadexpr_).expr_.fadexpr_.left_.constant_ *
              (*(Fad<double> **)((long)&(pFVar4->fadexpr_).expr_.fadexpr_ + 0x10))->val_);
  pFVar4 = (pFVar3->fadexpr_).right_;
  dVar9 = sin((pFVar4->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((pFVar4->fadexpr_).expr_.fadexpr_.right_)->val_);
  this->val_ = dVar9 * dVar8 * (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}